

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintKMap(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pObj;
  char *pcVar2;
  uint local_40;
  int fUseRealNames;
  int c;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  local_40 = 1;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"nh"), iVar1 != -1) {
    if ((iVar1 == 0x68) || (iVar1 != 0x6e)) goto LAB_00264389;
    local_40 = local_40 ^ 1;
  }
  if (argc == globalUtilOptind + 2) {
    Abc_NtkShow6VarFunc(argv[globalUtilOptind],argv[globalUtilOptind + 1]);
    pAbc_local._4_4_ = 0;
  }
  else if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"Empty network.\n");
    pAbc_local._4_4_ = 1;
  }
  else {
    iVar1 = Abc_NtkIsLogic(pNtk_00);
    if (iVar1 == 0) {
      Abc_Print(-1,"Visualization of Karnaugh maps works for logic networks.\n");
      pAbc_local._4_4_ = 1;
    }
    else if (globalUtilOptind + 1 < argc) {
      Abc_Print(-1,"Wrong number of auguments.\n");
LAB_00264389:
      Abc_Print(-2,"usage: print_kmap [-nh] <node>\n");
      Abc_Print(-2,"\t        shows the truth table of the node\n");
      pcVar2 = "dummy";
      if (local_40 != 0) {
        pcVar2 = "real";
      }
      Abc_Print(-2,"\t-n    : toggles real/dummy fanin names [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h    : print the command usage\n");
      Abc_Print(-2,"\t<node>: the node to consider (default = the driver of the first PO)\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      if (argc == globalUtilOptind) {
        pObj = Abc_NtkPo(pNtk_00,0);
        _fUseRealNames = Abc_ObjFanin0(pObj);
        iVar1 = Abc_ObjIsNode(_fUseRealNames);
        if (iVar1 == 0) {
          pcVar2 = Abc_ObjName(_fUseRealNames);
          Abc_Print(-1,"The driver \"%s\" of the first PO is not an internal node.\n",pcVar2);
          return 1;
        }
      }
      else {
        _fUseRealNames = Abc_NtkFindNode(pNtk_00,argv[globalUtilOptind]);
        if (_fUseRealNames == (Abc_Obj_t *)0x0) {
          Abc_Print(-1,"Cannot find node \"%s\".\n",argv[globalUtilOptind]);
          return 1;
        }
      }
      Abc_NtkToBdd(pNtk_00);
      Abc_NodePrintKMap(_fUseRealNames,local_40);
      pAbc_local._4_4_ = 0;
    }
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandPrintKMap( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c;
    int fUseRealNames;

    extern void Abc_NodePrintKMap( Abc_Obj_t * pNode, int fUseRealNames );

    // set defaults
    fUseRealNames = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "nh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            fUseRealNames ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 2 )
    {
        Abc_NtkShow6VarFunc( argv[globalUtilOptind], argv[globalUtilOptind+1] );
        return 0;
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Visualization of Karnaugh maps works for logic networks.\n" );
        return 1;
    }
    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }
    if ( argc == globalUtilOptind )
    {
        pNode = Abc_ObjFanin0( Abc_NtkPo(pNtk, 0) );
        if ( !Abc_ObjIsNode(pNode) )
        {
            Abc_Print( -1, "The driver \"%s\" of the first PO is not an internal node.\n", Abc_ObjName(pNode) );
            return 1;
        }
    }
    else
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
    }
    Abc_NtkToBdd(pNtk);
    Abc_NodePrintKMap( pNode, fUseRealNames );
    return 0;

usage:
    Abc_Print( -2, "usage: print_kmap [-nh] <node>\n" );
    Abc_Print( -2, "\t        shows the truth table of the node\n" );
    Abc_Print( -2, "\t-n    : toggles real/dummy fanin names [default = %s]\n", fUseRealNames? "real": "dummy" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    Abc_Print( -2, "\t<node>: the node to consider (default = the driver of the first PO)\n");
    return 1;
}